

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double bpser(double *a,double *b,double *x,double *eps)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((*x == 0.0) && (!NAN(*x))) {
    return 0.0;
  }
  bpser::a0 = *a;
  if (*b <= *a) {
    bpser::a0 = *b;
  }
  dVar3 = *a;
  if (1.0 <= bpser::a0) {
    dVar4 = log(*x);
    dVar7 = betaln(a,b);
    dVar3 = exp(dVar3 * dVar4 - dVar7);
    dVar3 = dVar3 / *a;
  }
  else {
    bpser::b0 = *b;
    if (*b <= dVar3) {
      bpser::b0 = dVar3;
    }
    if (8.0 <= bpser::b0) {
      dVar3 = gamln1(&bpser::a0);
      dVar4 = algdiv(&bpser::a0,&bpser::b0);
      bpser::u = dVar4 + dVar3;
      dVar3 = *a;
      dVar4 = log(*x);
      dVar7 = bpser::a0 / *a;
      dVar3 = exp(dVar4 * dVar3 - bpser::u);
      dVar3 = dVar3 * dVar7;
    }
    else if (bpser::b0 <= 1.0) {
      dVar3 = pow(*x,*a);
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        return dVar3;
      }
      bpser::apb = *a + *b;
      if (bpser::apb <= 1.0) {
        dVar4 = gam1(&bpser::apb);
        dVar4 = dVar4 + 1.0;
      }
      else {
        bpser::u = *a + *b + -1.0;
        dVar4 = gam1(&bpser::u);
        dVar4 = (dVar4 + 1.0) / bpser::apb;
      }
      dVar7 = gam1(a);
      dVar8 = gam1(b);
      auVar5._0_8_ = (dVar8 + 1.0) * (dVar7 + 1.0);
      auVar5._8_8_ = *b;
      auVar6._8_8_ = bpser::apb;
      auVar6._0_8_ = dVar4;
      auVar6 = divpd(auVar5,auVar6);
      dVar3 = dVar3 * auVar6._8_8_ * auVar6._0_8_;
    }
    else {
      bpser::u = gamln1(&bpser::a0);
      iVar1 = (int)(bpser::b0 + -1.0);
      if (0 < iVar1) {
        dVar3 = 1.0;
        while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
          bpser::b0 = bpser::b0 + -1.0;
          dVar3 = dVar3 * (bpser::b0 / (bpser::b0 + bpser::a0));
        }
        dVar3 = log(dVar3);
        bpser::u = dVar3 + bpser::u;
      }
      dVar3 = *a;
      dVar4 = log(*x);
      dVar3 = dVar4 * dVar3 - bpser::u;
      bpser::b0 = bpser::b0 + -1.0;
      bpser::apb = bpser::b0 + bpser::a0;
      if (bpser::apb <= 1.0) {
        dVar4 = gam1(&bpser::apb);
        bpser::t = dVar4 + 1.0;
      }
      else {
        bpser::u = bpser::apb + -1.0;
        dVar4 = gam1(&bpser::u);
        bpser::t = (dVar4 + 1.0) / bpser::apb;
      }
      dVar3 = exp(dVar3);
      dVar7 = bpser::a0 / *a;
      dVar4 = gam1(&bpser::b0);
      dVar3 = ((dVar4 + 1.0) * dVar7 * dVar3) / bpser::t;
    }
  }
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar4 = *a;
    if (*eps * 0.1 < dVar4) {
      dVar7 = 0.0;
      dVar8 = 1.0;
      dVar9 = 0.0;
      do {
        dVar9 = dVar9 + 1.0;
        dVar8 = dVar8 * ((0.5 - *b / dVar9) + 0.5) * *x;
        dVar10 = dVar8 / (dVar4 + dVar9);
        dVar7 = dVar7 + dVar10;
      } while (*eps / dVar4 < ABS(dVar10));
      dVar3 = dVar3 * (dVar4 * dVar7 + 1.0);
    }
  }
  return dVar3;
}

Assistant:

double bpser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------
     POWER SERIES EXPANSION FOR EVALUATING IX(A,B) WHEN B .LE. 1
     OR B*X .LE. 0.7.  EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static double bpser,a0,apb,b0,c,n,sum,t,tol,u,w,z;
static int i,m;
/*
     ..
     .. Executable Statements ..
*/
    bpser = 0.0e0;
    if(*x == 0.0e0) return bpser;
/*
-----------------------------------------------------------------------
            COMPUTE THE FACTOR X**A/(A*BETA(A,B))
-----------------------------------------------------------------------
*/
    a0 = fifdmin1(*a,*b);
    if(a0 < 1.0e0) goto S10;
    z = *a*log(*x)-betaln(a,b);
    bpser = exp(z)/ *a;
    goto S100;
S10:
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S90;
    if(b0 > 1.0e0) goto S40;
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .LE. 1
*/
    bpser = pow(*x,*a);
    if(bpser == 0.0e0) return bpser;
    apb = *a+*b;
    if(apb > 1.0e0) goto S20;
    z = 1.0e0+gam1(&apb);
    goto S30;
S20:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S30:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    bpser *= (c*(*b/apb));
    goto S100;
S40:
/*
         PROCEDURE FOR A0 .LT. 1 AND 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    m = b0-1.0e0;
    if(m < 1) goto S60;
    c = 1.0e0;
    for(i=1; i<=m; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S60:
    z = *a*log(*x)-u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S70;
    t = 1.0e0+gam1(&apb);
    goto S80;
S70:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S80:
    bpser = exp(z)*(a0/ *a)*(1.0e0+gam1(&b0))/t;
    goto S100;
S90:
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    z = *a*log(*x)-u;
    bpser = a0/ *a*exp(z);
S100:
    if(bpser == 0.0e0 || *a <= 0.1e0**eps) return bpser;
/*
-----------------------------------------------------------------------
                     COMPUTE THE SERIES
-----------------------------------------------------------------------
*/
    sum = n = 0.0e0;
    c = 1.0e0;
    tol = *eps/ *a;
S110:
    n += 1.0e0;
    c *= ((0.5e0+(0.5e0-*b/n))**x);
    w = c/(*a+n);
    sum += w;
    if(fabs(w) > tol) goto S110;
    bpser *= (1.0e0+*a*sum);
    return bpser;
}